

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardVariableSpecification.cpp
# Opt level: O2

void __thiscall
DIS::StandardVariableSpecification::unmarshal
          (StandardVariableSpecification *this,DataStream *dataStream)

{
  ulong uVar1;
  SimulationManagementPduHeader x;
  SimulationManagementPduHeader SStack_88;
  
  DataStream::operator>>(dataStream,&this->_numberOfStandardVariableRecords);
  std::
  vector<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>::
  clear(&this->_standardVariables);
  for (uVar1 = 0; uVar1 < this->_numberOfStandardVariableRecords; uVar1 = uVar1 + 1) {
    SimulationManagementPduHeader::SimulationManagementPduHeader(&SStack_88);
    SimulationManagementPduHeader::unmarshal(&SStack_88,dataStream);
    std::
    vector<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
    ::push_back(&this->_standardVariables,&SStack_88);
    SimulationManagementPduHeader::~SimulationManagementPduHeader(&SStack_88);
  }
  return;
}

Assistant:

void StandardVariableSpecification::unmarshal(DataStream& dataStream)
{
    dataStream >> _numberOfStandardVariableRecords;

     _standardVariables.clear();
     for(size_t idx = 0; idx < _numberOfStandardVariableRecords; idx++)
     {
        SimulationManagementPduHeader x;
        x.unmarshal(dataStream);
        _standardVariables.push_back(x);
     }
}